

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_CreateNumber(double num)

{
  cJSON *pcVar1;
  int iVar2;
  
  pcVar1 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (pcVar1 != (cJSON *)0x0) {
    pcVar1->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar1->type = 0;
    pcVar1->valuedouble = 0.0;
    pcVar1->string = (char *)0x0;
    pcVar1->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar1->valueint = 0;
    pcVar1->next = (cJSON *)0x0;
    pcVar1->prev = (cJSON *)0x0;
    pcVar1->type = 8;
    pcVar1->valuedouble = num;
    iVar2 = 0x7fffffff;
    if ((num < 2147483647.0) && (iVar2 = -0x80000000, -2147483648.0 < num)) {
      iVar2 = (int)num;
    }
    pcVar1->valueint = iVar2;
  }
  return pcVar1;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateNumber(double num)
{
    cJSON *item = cJSON_New_Item(&global_hooks);
    if(item)
    {
        item->type = cJSON_Number;
        item->valuedouble = num;

        /* use saturation in case of overflow */
        if (num >= INT_MAX)
        {
            item->valueint = INT_MAX;
        }
        else if (num <= INT_MIN)
        {
            item->valueint = INT_MIN;
        }
        else
        {
            item->valueint = (int)num;
        }
    }

    return item;
}